

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  buffer<char> *buf;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  string_view message_00;
  undefined **local_280;
  char *local_278;
  size_t sStack_270;
  ulong local_268;
  char local_260 [504];
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_48;
  char *system_message;
  undefined **local_38;
  
  system_message = (char *)message.size_;
  local_278 = local_260;
  local_38 = &PTR_grow_002bcbc0;
  local_280 = &PTR_grow_002bcbc0;
  local_268 = 500;
  sStack_270 = 500;
  do {
    local_48 = local_278;
    iVar3 = detail::safe_strerror(error_code,&local_48,sStack_270);
    if (iVar3 == 0x22) {
      uVar1 = sStack_270 * 2;
      if (local_268 < uVar1) {
        (*(code *)*local_280)(&local_280,uVar1);
      }
      sStack_270 = uVar1;
      if (local_268 < uVar1) {
        sStack_270 = local_268;
      }
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      if (iVar3 == 0) {
        local_60 = system_message;
        local_58 = local_48;
        in_R8.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_68;
        format_str.size_ = 6;
        format_str.data_ = "{}: {}";
        args.field_1.values_ = in_R8.values_;
        args.desc_ = 0xcd;
        local_68 = message.data_;
        vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
                  ((iterator)out,format_str,args,(locale_ref)0x0);
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      bVar2 = false;
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    bVar2 = true;
  }
  local_280 = local_38;
  if (local_278 != local_260) {
    operator_delete(local_278,local_268);
  }
  if (bVar2) {
    message_00.size_ = (size_t)in_R8.values_;
    message_00.data_ = system_message;
    detail::format_error_code
              ((detail *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }